

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O0

void CheckFile(string *name,string *expected_string)

{
  bool bVar1;
  size_type t;
  string *str;
  char *pcVar2;
  ostream *poVar3;
  reference pvVar4;
  string *in_RSI;
  char buf [1000];
  FILE *file;
  CheckOpString _result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  CheckOpString *in_stack_fffffffffffffae8;
  LogMessageFatal *in_stack_fffffffffffffaf0;
  unsigned_long *in_stack_fffffffffffffaf8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  LogMessage local_4a8;
  char local_498 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbc8;
  string *in_stack_fffffffffffffbd0;
  LogMessage local_a0;
  LogMessageVoidify local_89;
  FILE *local_88;
  LogMessage local_80;
  unsigned_long local_70;
  unsigned_long local_68;
  CheckOpString local_60 [3];
  string local_48 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  string *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x131ea4);
  std::operator+(in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  GetFiles(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_48);
  t = std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::size(&local_28);
  local_68 = google::GetReferenceableValue(t);
  local_70 = google::GetReferenceableValue(1);
  str = google::Check_EQImpl<unsigned_long,unsigned_long>
                  (in_stack_fffffffffffffaf8,(unsigned_long *)in_stack_fffffffffffffaf0,
                   (char *)in_stack_fffffffffffffae8);
  google::CheckOpString::CheckOpString(local_60,str);
  bVar1 = google::CheckOpString::operator_cast_to_bool(local_60);
  if (bVar1) {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)in_stack_fffffffffffffb00,(char *)in_stack_fffffffffffffaf8,
               (int)((ulong)in_stack_fffffffffffffaf0 >> 0x20),in_stack_fffffffffffffae8);
    google::LogMessage::stream(&local_80);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_00131fb9);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&local_28,0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_88 = fopen(pcVar2,"r");
  if (local_88 == (FILE *)0x0) {
    google::LogMessageVoidify::LogMessageVoidify(&local_89);
    google::LogMessageFatal::LogMessageFatal
              (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,0);
    poVar3 = google::LogMessage::stream(&local_a0);
    poVar3 = std::operator<<(poVar3,"Check failed: file != NULL ");
    poVar3 = std::operator<<(poVar3,": could not open ");
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_28,0);
    poVar3 = std::operator<<(poVar3,(string *)pvVar4);
    google::LogMessageVoidify::operator&(&local_89,poVar3);
    google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_0013213e);
  }
  do {
    pcVar2 = fgets(local_498,1000,local_88);
    if (pcVar2 == (char *)0x0) {
      fclose(local_88);
      google::LogMessageFatal::LogMessageFatal
                (in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,0);
      poVar3 = google::LogMessage::stream(&local_4a8);
      poVar3 = std::operator<<(poVar3,"Did not find ");
      poVar3 = std::operator<<(poVar3,local_10);
      poVar3 = std::operator<<(poVar3," in ");
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_28,0);
      std::operator<<(poVar3,(string *)pvVar4);
      google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LAB_001322a4);
    }
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = strstr(local_498,pcVar2);
  } while (pcVar2 == (char *)0x0);
  fclose(local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffb00);
  return;
}

Assistant:

static void CheckFile(const string& name, const string& expected_string) {
  vector<string> files;
  GetFiles(name + "*", &files);
  CHECK_EQ(files.size(), 1UL);

  FILE* file = fopen(files[0].c_str(), "r");
  CHECK(file != NULL) << ": could not open " << files[0];
  char buf[1000];
  while (fgets(buf, sizeof(buf), file) != NULL) {
    if (strstr(buf, expected_string.c_str()) != NULL) {
      fclose(file);
      return;
    }
  }
  fclose(file);
  LOG(FATAL) << "Did not find " << expected_string << " in " << files[0];
}